

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

aiMesh * __thiscall Assimp::D3MF::XmlSerializer::ReadMesh(XmlSerializer *this)

{
  bool bVar1;
  int iVar2;
  aiMesh *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiMesh *mesh;
  XmlSerializer *this_local;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  while (bVar1 = ReadToEndElement(this,(string *)XmlTag::mesh_abi_cxx11_), bVar1) {
    iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    bVar1 = std::operator==((char *)CONCAT44(extraout_var,iVar2),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            XmlTag::vertices_abi_cxx11_);
    if (bVar1) {
      ImportVertices(this,this_00);
    }
    else {
      iVar2 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
      bVar1 = std::operator==((char *)CONCAT44(extraout_var_00,iVar2),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              XmlTag::triangles_abi_cxx11_);
      if (bVar1) {
        ImportTriangles(this,this_00);
      }
    }
  }
  return this_00;
}

Assistant:

aiMesh *ReadMesh() {
        aiMesh* mesh = new aiMesh();
        while(ReadToEndElement(D3MF::XmlTag::mesh)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::vertices) {
                ImportVertices(mesh);
            } else if(xmlReader->getNodeName() == D3MF::XmlTag::triangles) {
                ImportTriangles(mesh);
            }
        }

        return mesh;
    }